

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_navigationarrow.cpp
# Opt level: O3

void QtMWidgets::NavigationArrow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Direction *pDVar1;
  undefined8 uVar2;
  Direction DVar3;
  QColor *pQVar4;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      _q_timer((NavigationArrow *)_o);
      return;
    }
    if (_id == 1) {
      animate((NavigationArrow *)_o);
      return;
    }
    if (_id == 0) {
      QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
      return;
    }
    break;
  case ReadProperty:
    pDVar1 = (Direction *)*_a;
    if (_id == 1) {
      pQVar4 = color((NavigationArrow *)_o);
      uVar2 = *(undefined8 *)((long)&pQVar4->ct + 2);
      *(undefined8 *)pDVar1 = *(undefined8 *)pQVar4;
      *(undefined8 *)((long)pDVar1 + 6) = uVar2;
    }
    else if (_id == 0) {
      DVar3 = direction((NavigationArrow *)_o);
      *pDVar1 = DVar3;
    }
    break;
  case WriteProperty:
    if (_id == 1) {
      setColor((NavigationArrow *)_o,(QColor *)*_a);
      return;
    }
    if (_id == 0) {
      setDirection((NavigationArrow *)_o,((QColor *)*_a)->cspec);
      return;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == clicked) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  return;
}

Assistant:

void QtMWidgets::NavigationArrow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<NavigationArrow *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->clicked(); break;
        case 1: _t->animate(); break;
        case 2: _t->_q_timer(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (NavigationArrow::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&NavigationArrow::clicked)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<NavigationArrow *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< Direction*>(_v) = _t->direction(); break;
        case 1: *reinterpret_cast< QColor*>(_v) = _t->color(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<NavigationArrow *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDirection(*reinterpret_cast< Direction*>(_v)); break;
        case 1: _t->setColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_a;
}